

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

void __thiscall
duckdb::Deserializer::
ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>,_true> *ret)

{
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  int iVar3;
  undefined6 in_register_00000032;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_20;
  
  iVar3 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  if ((char)iVar3 != '\0') {
    Read<duckdb::unique_ptr<duckdb::QueryNode,std::default_delete<duckdb::QueryNode>,true>,duckdb::QueryNode>
              ((Deserializer *)&stack0xffffffffffffffe0);
    _Var2._M_head_impl = local_20._M_head_impl;
    local_20._M_head_impl = (QueryNode *)0x0;
    _Var1._M_head_impl =
         (ret->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (ret->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (_Var1._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
      if (local_20._M_head_impl != (QueryNode *)0x0) {
        (**(code **)(*(_func_int **)local_20._M_head_impl + 8))();
      }
    }
    (*this->_vptr_Deserializer[5])(this,1);
    return;
  }
  _Var1._M_head_impl =
       (ret->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
       super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (ret->super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>)._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
  if (_Var1._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
  }
  (*this->_vptr_Deserializer[5])(this,0);
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}